

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O2

void start_output_ppm(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo)

{
  uint uVar1;
  uint uVar2;
  jpeg_error_mgr *pjVar3;
  char *__format;
  FILE *__stream;
  
  switch(cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    __stream = (FILE *)dinfo->output_file;
    uVar1 = cinfo->output_width;
    uVar2 = cinfo->output_height;
    __format = "P5\n%ld %ld\n%d\n";
    break;
  default:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x404;
    (*pjVar3->error_exit)((j_common_ptr)cinfo);
    return;
  case JCS_CMYK:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
    if ((cinfo->out_color_space < JCS_EXT_RGB) && (cinfo->quantize_colors != 0)) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x404;
      (*pjVar3->error_exit)((j_common_ptr)cinfo);
    }
  case JCS_RGB:
    __stream = (FILE *)dinfo->output_file;
    uVar1 = cinfo->output_width;
    uVar2 = cinfo->output_height;
    __format = "P6\n%ld %ld\n%d\n";
  }
  fprintf(__stream,__format,(ulong)uVar1,(ulong)uVar2,0xff);
  return;
}

Assistant:

METHODDEF(void)
start_output_ppm(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;

  /* Emit file header */
  switch (cinfo->out_color_space) {
  case JCS_GRAYSCALE:
    /* emit header for raw PGM format */
    fprintf(dest->pub.output_file, "P5\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  case JCS_RGB:
  case JCS_EXT_RGB:
  case JCS_EXT_RGBX:
  case JCS_EXT_BGR:
  case JCS_EXT_BGRX:
  case JCS_EXT_XBGR:
  case JCS_EXT_XRGB:
  case JCS_EXT_RGBA:
  case JCS_EXT_BGRA:
  case JCS_EXT_ABGR:
  case JCS_EXT_ARGB:
  case JCS_CMYK:
    if (!IsExtRGB(cinfo->out_color_space) && cinfo->quantize_colors)
      ERREXIT(cinfo, JERR_PPM_COLORSPACE);
    /* emit header for raw PPM format */
    fprintf(dest->pub.output_file, "P6\n%ld %ld\n%d\n",
            (long)cinfo->output_width, (long)cinfo->output_height, PPM_MAXVAL);
    break;
  default:
    ERREXIT(cinfo, JERR_PPM_COLORSPACE);
  }
}